

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void * XML_GetBuffer(XML_Parser parser,int len)

{
  XML_Parsing XVar1;
  uint uVar2;
  char *__dest;
  int iVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  
  if (parser == (XML_Parser)0x0) {
    return (void *)0x0;
  }
  if (len < 0) goto LAB_003f9a27;
  XVar1 = (parser->m_parsingStatus).parsing;
  if (XVar1 == XML_FINISHED) {
    parser->m_errorCode = XML_ERROR_FINISHED;
    return (void *)0x0;
  }
  if (XVar1 == XML_SUSPENDED) {
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return (void *)0x0;
  }
  pcVar9 = parser->m_bufferLim;
  if ((pcVar9 == (char *)0x0) || (parser->m_bufferEnd == (char *)0x0)) {
    lVar4 = 0;
  }
  else {
    lVar4 = (long)pcVar9 - (long)parser->m_bufferEnd;
  }
  __dest = parser->m_bufferEnd;
  if ((long)(ulong)(uint)len <= lVar4) {
    return __dest;
  }
  iVar3 = 0;
  if ((__dest != (char *)0x0) && (iVar3 = 0, parser->m_bufferPtr != (char *)0x0)) {
    iVar3 = (int)__dest - (int)parser->m_bufferPtr;
  }
  if (iVar3 + len < 0) goto LAB_003f9a27;
  pcVar6 = parser->m_bufferPtr;
  iVar7 = 0;
  if ((pcVar6 != (char *)0x0) && (parser->m_buffer != (char *)0x0)) {
    iVar7 = (int)pcVar6 - (int)parser->m_buffer;
  }
  iVar8 = 0x400;
  if (iVar7 < 0x400) {
    iVar8 = iVar7;
  }
  iVar3 = iVar3 + len + iVar8;
  if (pcVar9 == (char *)0x0) {
    if (iVar3 < 1) goto LAB_003f9a43;
LAB_003f9974:
    uVar2 = 0x400;
LAB_003f9979:
    do {
      uVar2 = uVar2 * 2;
      if (iVar3 <= (int)uVar2) break;
    } while (0 < (int)uVar2);
    if ((int)uVar2 < 1) {
LAB_003f9a27:
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return (void *)0x0;
    }
    __dest = (char *)(*(parser->m_mem).malloc_fcn)((ulong)uVar2);
    if (__dest == (char *)0x0) goto LAB_003f9a27;
    parser->m_bufferLim = __dest + uVar2;
    pcVar9 = parser->m_bufferPtr;
    if (pcVar9 == (char *)0x0) {
      parser->m_bufferEnd = __dest;
      parser->m_buffer = __dest;
      pcVar9 = __dest;
    }
    else {
      iVar3 = (int)pcVar9 - (int)parser->m_buffer;
      if (0x3ff < iVar3) {
        iVar3 = 0x400;
      }
      lVar4 = 0;
      if (parser->m_buffer == (char *)0x0) {
        iVar3 = 0;
      }
      lVar5 = (long)parser->m_bufferEnd - (long)pcVar9;
      if (parser->m_bufferEnd == (char *)0x0) {
        lVar5 = 0;
      }
      memcpy(__dest,pcVar9 + -iVar3,lVar5 + iVar3);
      (*(parser->m_mem).free_fcn)(parser->m_buffer);
      parser->m_buffer = __dest;
      if (parser->m_bufferEnd != (char *)0x0) {
        if (parser->m_bufferPtr == (char *)0x0) {
          lVar4 = 0;
        }
        else {
          lVar4 = (long)parser->m_bufferEnd - (long)parser->m_bufferPtr;
        }
      }
      pcVar9 = __dest + iVar3;
      __dest = pcVar9 + lVar4;
      parser->m_bufferEnd = __dest;
    }
  }
  else {
    lVar4 = (long)pcVar9 - (long)parser->m_buffer;
    if (parser->m_buffer == (char *)0x0) {
      lVar4 = 0;
    }
    if (lVar4 < iVar3) {
      if ((pcVar6 == (char *)0x0) || (uVar2 = (int)pcVar9 - (int)pcVar6, uVar2 == 0))
      goto LAB_003f9974;
      goto LAB_003f9979;
    }
LAB_003f9a43:
    if (pcVar6 == (char *)0x0) {
      if (-1 < iVar7) goto LAB_003f9ac3;
      pcVar9 = parser->m_buffer;
      pcVar6 = (char *)0x0;
      iVar3 = 0;
    }
    else {
      pcVar9 = parser->m_buffer;
      lVar4 = (long)pcVar6 - (long)pcVar9;
      if (pcVar9 == (char *)0x0) {
        lVar4 = 0;
      }
      if (lVar4 <= iVar8) goto LAB_003f9ac3;
      iVar3 = (int)((long)pcVar6 - (long)pcVar9);
      if (pcVar9 == (char *)0x0) {
        iVar3 = 0;
      }
    }
    lVar4 = (long)(iVar3 - iVar8);
    memmove(pcVar9,pcVar9 + lVar4,(size_t)(__dest + ((long)iVar8 - (long)pcVar6)));
    __dest = parser->m_bufferEnd + -lVar4;
    parser->m_bufferEnd = __dest;
    pcVar9 = parser->m_bufferPtr + -lVar4;
  }
  parser->m_bufferPtr = pcVar9;
LAB_003f9ac3:
  parser->m_eventPtr = (char *)0x0;
  parser->m_eventEndPtr = (char *)0x0;
  parser->m_positionPtr = (char *)0x0;
  return __dest;
}

Assistant:

void * XMLCALL
XML_GetBuffer(XML_Parser parser, int len)
{
  if (parser == NULL)
    return NULL;
  if (len < 0) {
    parser->m_errorCode = XML_ERROR_NO_MEMORY;
    return NULL;
  }
  switch (parser->m_parsingStatus.parsing) {
  case XML_SUSPENDED:
    parser->m_errorCode = XML_ERROR_SUSPENDED;
    return NULL;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return NULL;
  default: ;
  }

  if (len > EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferEnd)) {
#ifdef XML_CONTEXT_BYTES
    int keep;
#endif  /* defined XML_CONTEXT_BYTES */
    /* Do not invoke signed arithmetic overflow: */
    int neededSize = (int) ((unsigned)len +
                            (unsigned)EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd,
                                                          parser->m_bufferPtr));
    if (neededSize < 0) {
      parser->m_errorCode = XML_ERROR_NO_MEMORY;
      return NULL;
    }
#ifdef XML_CONTEXT_BYTES
    keep = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    neededSize += keep;
#endif  /* defined XML_CONTEXT_BYTES */
    if (neededSize <= EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_buffer)) {
#ifdef XML_CONTEXT_BYTES
      if (keep < EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer)) {
          int offset = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer) - keep;
        /* The buffer pointers cannot be NULL here; we have at least some bytes in the buffer */
        memmove(parser->m_buffer, &parser->m_buffer[offset], parser->m_bufferEnd - parser->m_bufferPtr + keep);
        parser->m_bufferEnd -= offset;
        parser->m_bufferPtr -= offset;
      }
#else
      if (parser->m_buffer && parser->m_bufferPtr) {
        memmove(parser->m_buffer, parser->m_bufferPtr,
                EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        parser->m_bufferEnd = parser->m_buffer +
            EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
        parser->m_bufferPtr = parser->m_buffer;
      }
#endif  /* not defined XML_CONTEXT_BYTES */
    }
    else {
      char *newBuf;
      int bufferSize = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferLim, parser->m_bufferPtr);
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        /* Do not invoke signed arithmetic overflow: */
        bufferSize = (int) (2U * (unsigned) bufferSize);
      } while (bufferSize < neededSize && bufferSize > 0);
      if (bufferSize <= 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      newBuf = (char *)MALLOC(parser, bufferSize);
      if (newBuf == 0) {
        parser->m_errorCode = XML_ERROR_NO_MEMORY;
        return NULL;
      }
      parser->m_bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (parser->m_bufferPtr) {
        int keep = (int)EXPAT_SAFE_PTR_DIFF(parser->m_bufferPtr, parser->m_buffer);
        if (keep > XML_CONTEXT_BYTES)
          keep = XML_CONTEXT_BYTES;
        memcpy(newBuf, &parser->m_bufferPtr[-keep],
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr) + keep);
        FREE(parser, parser->m_buffer);
        parser->m_buffer = newBuf;
        parser->m_bufferEnd = parser->m_buffer +
            EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr) + keep;
        parser->m_bufferPtr = parser->m_buffer + keep;
      }
      else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
        parser->m_bufferPtr = parser->m_buffer = newBuf;
      }
#else
      if (parser->m_bufferPtr) {
        memcpy(newBuf, parser->m_bufferPtr,
               EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr));
        FREE(parser, parser->m_buffer);
        parser->m_bufferEnd = newBuf +
            EXPAT_SAFE_PTR_DIFF(parser->m_bufferEnd, parser->m_bufferPtr);
      }
      else {
        /* This must be a brand new buffer with no data in it yet */
        parser->m_bufferEnd = newBuf;
      }
      parser->m_bufferPtr = parser->m_buffer = newBuf;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
    parser->m_eventPtr = parser->m_eventEndPtr = NULL;
    parser->m_positionPtr = NULL;
  }
  return parser->m_bufferEnd;
}